

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int JS_ExecutePendingJob(JSRuntime *rt,JSContext **pctx)

{
  int iVar1;
  list_head *plVar2;
  list_head *plVar3;
  JSValueUnion JVar4;
  long lVar5;
  int iVar6;
  list_head *plVar7;
  JSRefCountHeader *p_1;
  JSContext *pJVar8;
  JSValue v;
  JSValue v_00;
  
  plVar2 = (rt->job_list).next;
  if (plVar2 == &rt->job_list) {
    pJVar8 = (JSContext *)0x0;
    iVar6 = 0;
  }
  else {
    plVar7 = plVar2->prev;
    plVar3 = plVar2->next;
    plVar7->next = plVar3;
    plVar3->prev = plVar7;
    plVar2->prev = (list_head *)0x0;
    plVar2->next = (list_head *)0x0;
    pJVar8 = (JSContext *)plVar2[1].prev;
    v_00 = (JSValue)(*(code *)plVar2[1].next)(pJVar8,*(undefined4 *)&plVar2[2].prev,&plVar2[2].next)
    ;
    iVar6 = *(int *)&plVar2[2].prev;
    if (0 < iVar6) {
      plVar7 = plVar2 + 3;
      lVar5 = 0;
      do {
        plVar3 = plVar7->prev;
        if (0xfffffff4 < (uint)plVar3) {
          JVar4 = (JSValueUnion)plVar7[-1].next;
          iVar1 = *JVar4.ptr;
          *(int *)JVar4.ptr = iVar1 + -1;
          if (iVar1 < 2) {
            v.tag = (int64_t)plVar3;
            v.u.ptr = JVar4.ptr;
            __JS_FreeValueRT(pJVar8->rt,v);
            iVar6 = *(int *)&plVar2[2].prev;
          }
        }
        lVar5 = lVar5 + 1;
        plVar7 = plVar7 + 1;
      } while (lVar5 < iVar6);
    }
    if ((0xfffffff4 < (uint)v_00.tag) &&
       (iVar6 = *v_00.u.ptr, *(int *)v_00.u.ptr = iVar6 + -1, iVar6 < 2)) {
      __JS_FreeValueRT(pJVar8->rt,v_00);
    }
    iVar6 = (uint)((uint)v_00.tag != 6) * 2 + -1;
    (*(pJVar8->rt->mf).js_free)(&pJVar8->rt->malloc_state,plVar2);
  }
  *pctx = pJVar8;
  return iVar6;
}

Assistant:

int JS_ExecutePendingJob(JSRuntime *rt, JSContext **pctx)
{
    JSContext *ctx;
    JSJobEntry *e;
    JSValue res;
    int i, ret;

    if (list_empty(&rt->job_list)) {
        *pctx = NULL;
        return 0;
    }

    /* get the first pending job and execute it */
    e = list_entry(rt->job_list.next, JSJobEntry, link);
    list_del(&e->link);
    ctx = e->ctx;
    res = e->job_func(e->ctx, e->argc, (JSValueConst *)e->argv);
    for(i = 0; i < e->argc; i++)
        JS_FreeValue(ctx, e->argv[i]);
    if (JS_IsException(res))
        ret = -1;
    else
        ret = 1;
    JS_FreeValue(ctx, res);
    js_free(ctx, e);
    *pctx = ctx;
    return ret;
}